

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

bool __thiscall Minisat::Solver::addClause_(Solver *this,vec<Minisat::Lit> *ps)

{
  bool bVar1;
  lbool lVar2;
  int iVar3;
  uint uVar4;
  CRef CVar5;
  Lit *pLVar6;
  ulong uVar7;
  undefined7 uVar9;
  uchar *puVar8;
  size_t *siglen;
  size_t *extraout_RDX;
  size_t *siglen_00;
  size_t *siglen_01;
  size_t *siglen_02;
  vec<Minisat::Lit> *in_RSI;
  uchar *puVar10;
  long in_RDI;
  size_t in_R8;
  CRef cr;
  int i_1;
  bool someNegative;
  bool somePositive;
  int j;
  int i;
  Lit p;
  Solver *in_stack_000001a0;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  byte in_stack_ffffffffffffff5c;
  byte in_stack_ffffffffffffff5d;
  byte in_stack_ffffffffffffff5e;
  undefined1 in_stack_ffffffffffffff5f;
  vec<Minisat::Lit> *in_stack_ffffffffffffff60;
  undefined1 learnt;
  undefined4 in_stack_ffffffffffffff68;
  uint uVar11;
  Solver *in_stack_ffffffffffffff70;
  lbool local_61;
  int local_60;
  lbool local_59;
  uint local_58;
  uint local_54;
  int local_50;
  lbool local_49;
  int local_48;
  CRef in_stack_ffffffffffffffbc;
  Lit in_stack_ffffffffffffffc0;
  Lit in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  lbool local_2d;
  Lit in_stack_ffffffffffffffd4;
  int iVar12;
  byte local_26;
  byte local_25;
  uint local_24;
  uint local_20;
  Lit local_1c;
  bool local_1;
  
  if ((*(byte *)(in_RDI + 0x228) & 1) == 0) {
    local_1 = false;
  }
  else {
    if ((*(byte *)(in_RDI + 0x491) & 1) != 0) {
      SATchecker::addClause
                ((SATchecker *)in_stack_ffffffffffffff60,
                 (vec<Minisat::Lit> *)
                 CONCAT17(in_stack_ffffffffffffff5f,
                          CONCAT16(in_stack_ffffffffffffff5e,
                                   CONCAT15(in_stack_ffffffffffffff5d,
                                            CONCAT14(in_stack_ffffffffffffff5c,
                                                     in_stack_ffffffffffffff58)))));
    }
    sort<Minisat::Lit>((vec<Minisat::Lit> *)
                       CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    local_25 = 0;
    local_26 = 0;
    if (*(long *)(in_RDI + 0x28) != 0) {
      vec<Minisat::Lit>::clear
                ((vec<Minisat::Lit> *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 (bool)in_stack_ffffffffffffff4f);
      iVar12 = 0;
      while (in_stack_ffffffffffffffd4.x = iVar12, iVar3 = vec<Minisat::Lit>::size(in_RSI),
            iVar12 < iVar3) {
        in_stack_ffffffffffffff70 = (Solver *)(in_RDI + 0x5b0);
        vec<Minisat::Lit>::operator[](in_RSI,in_stack_ffffffffffffffd4.x);
        vec<Minisat::Lit>::push
                  ((vec<Minisat::Lit> *)
                   CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                   (Lit *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
        iVar12 = in_stack_ffffffffffffffd4.x + 1;
      }
    }
    local_24 = 0;
    local_20 = 0;
    local_1c.x = -2;
    while( true ) {
      uVar11 = local_20;
      uVar4 = vec<Minisat::Lit>::size(in_RSI);
      uVar7 = (ulong)uVar4;
      if ((int)uVar4 <= (int)uVar11) break;
      pLVar6 = vec<Minisat::Lit>::operator[](in_RSI,local_20);
      in_stack_ffffffffffffffcc = pLVar6->x;
      local_2d = value((Solver *)
                       CONCAT17(in_stack_ffffffffffffff5f,
                                CONCAT16(in_stack_ffffffffffffff5e,
                                         CONCAT15(in_stack_ffffffffffffff5d,
                                                  CONCAT14(in_stack_ffffffffffffff5c,
                                                           in_stack_ffffffffffffff58)))),
                       (Lit)(int)in_stack_ffffffffffffff60);
      lbool::lbool((lbool *)&stack0xffffffffffffffcb,'\0');
      bVar1 = lbool::operator==(&local_2d,(lbool)(uint8_t)((uint)in_stack_ffffffffffffffc8 >> 0x18))
      ;
      uVar9 = (undefined7)(uVar7 >> 8);
      in_stack_ffffffffffffff68 = CONCAT13(1,(int3)in_stack_ffffffffffffff68);
      if (!bVar1) {
        in_stack_ffffffffffffff60 =
             (vec<Minisat::Lit> *)vec<Minisat::Lit>::operator[](in_RSI,local_20);
        in_stack_ffffffffffffffc0.x = local_1c.x;
        in_stack_ffffffffffffffc4 = operator~(local_1c);
        bVar1 = Lit::operator==((Lit *)in_stack_ffffffffffffff60,in_stack_ffffffffffffffc4);
        in_stack_ffffffffffffff68 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff68);
      }
      if ((char)((uint)in_stack_ffffffffffffff68 >> 0x18) != '\0') {
        return true;
      }
      pLVar6 = vec<Minisat::Lit>::operator[](in_RSI,local_20);
      local_48 = pLVar6->x;
      lVar2 = value((Solver *)
                    CONCAT17(in_stack_ffffffffffffff5f,
                             CONCAT16(in_stack_ffffffffffffff5e,
                                      CONCAT15(in_stack_ffffffffffffff5d,
                                               CONCAT14(in_stack_ffffffffffffff5c,
                                                        in_stack_ffffffffffffff58)))),
                    (Lit)(int)in_stack_ffffffffffffff60);
      in_stack_ffffffffffffffbc = CONCAT13(lVar2.value,(int3)in_stack_ffffffffffffffbc);
      lbool::lbool(&local_49,'\x01');
      bVar1 = lbool::operator!=((lbool *)CONCAT17(in_stack_ffffffffffffff4f,
                                                  in_stack_ffffffffffffff48),
                                (lbool)(uint8_t)((uint)in_stack_ffffffffffffff54 >> 0x18));
      puVar8 = (uchar *)CONCAT71(uVar9,bVar1);
      in_stack_ffffffffffffff5f = false;
      if (bVar1) {
        pLVar6 = vec<Minisat::Lit>::operator[](in_RSI,local_20);
        local_50 = local_1c.x;
        in_stack_ffffffffffffff5f = Lit::operator!=(pLVar6,local_1c);
      }
      if ((bool)in_stack_ffffffffffffff5f == false) {
        pLVar6 = vec<Minisat::Lit>::operator[](in_RSI,local_20);
        local_60 = pLVar6->x;
        local_59 = value((Solver *)
                         CONCAT17(in_stack_ffffffffffffff5f,
                                  CONCAT16(in_stack_ffffffffffffff5e,
                                           CONCAT15(in_stack_ffffffffffffff5d,
                                                    CONCAT14(in_stack_ffffffffffffff5c,
                                                             in_stack_ffffffffffffff58)))),
                         (Lit)(int)in_stack_ffffffffffffff60);
        lbool::lbool(&local_61,'\x01');
        bVar1 = lbool::operator==(&local_59,local_61);
        if (bVar1) {
          in_stack_ffffffffffffff5c = 1;
          if (local_25 == 0) {
            puVar10 = (uchar *)(ulong)local_20;
            pLVar6 = vec<Minisat::Lit>::operator[](in_RSI,local_20);
            iVar12 = sign((EVP_PKEY_CTX *)(ulong)(uint)pLVar6->x,puVar10,siglen_01,puVar8,in_R8);
            in_stack_ffffffffffffff5c = (byte)iVar12 ^ 0xff;
          }
          local_25 = in_stack_ffffffffffffff5c & 1;
          in_stack_ffffffffffffff58 = CONCAT13(1,(int3)in_stack_ffffffffffffff58);
          if (local_26 == 0) {
            puVar10 = (uchar *)(ulong)local_20;
            pLVar6 = vec<Minisat::Lit>::operator[](in_RSI,local_20);
            iVar12 = sign((EVP_PKEY_CTX *)(ulong)(uint)pLVar6->x,puVar10,siglen_02,puVar8,in_R8);
            in_stack_ffffffffffffff58 = CONCAT13((char)iVar12,(int3)in_stack_ffffffffffffff58);
          }
          local_26 = (byte)((uint)in_stack_ffffffffffffff58 >> 0x18) & 1;
        }
      }
      else {
        pLVar6 = vec<Minisat::Lit>::operator[](in_RSI,local_20);
        local_1c.x = pLVar6->x;
        puVar10 = (uchar *)(ulong)local_24;
        pLVar6 = vec<Minisat::Lit>::operator[](in_RSI,local_24);
        puVar8 = (uchar *)(ulong)(uint)local_1c.x;
        pLVar6->x = local_1c.x;
        in_stack_ffffffffffffff5e = 1;
        siglen_00 = siglen;
        if (local_25 == 0) {
          local_54 = local_1c.x;
          iVar12 = sign((EVP_PKEY_CTX *)(ulong)(uint)local_1c.x,puVar10,siglen,puVar8,in_R8);
          in_stack_ffffffffffffff5e = (byte)iVar12 ^ 0xff;
          siglen_00 = extraout_RDX;
        }
        local_25 = in_stack_ffffffffffffff5e & 1;
        in_stack_ffffffffffffff5d = 1;
        if (local_26 == 0) {
          local_58 = local_1c.x;
          iVar12 = sign((EVP_PKEY_CTX *)(ulong)(uint)local_1c.x,puVar10,siglen_00,puVar8,in_R8);
          in_stack_ffffffffffffff5d = (byte)iVar12;
        }
        local_26 = in_stack_ffffffffffffff5d & 1;
        local_24 = local_24 + 1;
      }
      local_20 = local_20 + 1;
    }
    vec<Minisat::Lit>::shrink(in_RSI,local_20 - local_24);
    *(undefined1 *)(in_RDI + 0x13a0) = 0;
    if ((*(long *)(in_RDI + 0x28) != 0) && (local_20 != local_24)) {
      binDRUP<Minisat::vec<Minisat::Lit>>
                (in_stack_ffffffffffffff70,(uchar)(uVar11 >> 0x18),in_stack_ffffffffffffff60,
                 (FILE *)CONCAT17(in_stack_ffffffffffffff5f,
                                  CONCAT16(in_stack_ffffffffffffff5e,
                                           CONCAT15(in_stack_ffffffffffffff5d,
                                                    CONCAT14(in_stack_ffffffffffffff5c,
                                                             in_stack_ffffffffffffff58)))));
      binDRUP<Minisat::vec<Minisat::Lit>>
                (in_stack_ffffffffffffff70,(uchar)(uVar11 >> 0x18),in_stack_ffffffffffffff60,
                 (FILE *)CONCAT17(in_stack_ffffffffffffff5f,
                                  CONCAT16(in_stack_ffffffffffffff5e,
                                           CONCAT15(in_stack_ffffffffffffff5d,
                                                    CONCAT14(in_stack_ffffffffffffff5c,
                                                             in_stack_ffffffffffffff58)))));
    }
    learnt = (undefined1)((ulong)in_stack_ffffffffffffff60 >> 0x38);
    iVar12 = vec<Minisat::Lit>::size(in_RSI);
    if (iVar12 == 0) {
      *(undefined1 *)(in_RDI + 0x228) = 0;
      local_1 = false;
    }
    else {
      iVar12 = vec<Minisat::Lit>::size(in_RSI);
      if (iVar12 == 1) {
        vec<Minisat::Lit>::operator[](in_RSI,0);
        uncheckedEnqueue((Solver *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                         in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc4.x,
                         in_stack_ffffffffffffffc0.x);
        CVar5 = propagate(in_stack_000001a0);
        local_1 = CVar5 == 0xffffffff;
        *(bool *)(in_RDI + 0x228) = local_1;
      }
      else {
        ClauseAllocator::alloc<Minisat::vec<Minisat::Lit>>
                  ((ClauseAllocator *)in_stack_ffffffffffffff70,
                   (vec<Minisat::Lit> *)CONCAT44(uVar11,in_stack_ffffffffffffff68),(bool)learnt);
        vec<unsigned_int>::push
                  ((vec<unsigned_int> *)
                   CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                   (uint *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
        attachClause((Solver *)CONCAT44(in_stack_ffffffffffffffc4.x,in_stack_ffffffffffffffc0.x),
                     in_stack_ffffffffffffffbc);
        if (*(int *)(in_RDI + 0x188) == 0) {
          if (local_25 == 0) {
            iVar12 = *(int *)(in_RDI + 0x18c) + 1;
          }
          else {
            iVar12 = *(int *)(in_RDI + 0x18c);
          }
          *(int *)(in_RDI + 0x18c) = iVar12;
          if (local_26 == 0) {
            iVar12 = *(int *)(in_RDI + 400) + 1;
          }
          else {
            iVar12 = *(int *)(in_RDI + 400);
          }
          *(int *)(in_RDI + 400) = iVar12;
        }
        local_1 = true;
      }
    }
  }
  return local_1;
}

Assistant:

bool Solver::addClause_(vec<Lit> &ps)
{
    assert(decisionLevel() == 0);
    if (!ok) return false;

    if (check_satisfiability) satChecker.addClause(ps); // add for SAT check tracking

    // Check if clause is satisfied and remove false/duplicate literals:
    sort(ps);
    Lit p;
    int i, j;

    bool somePositive = false;
    bool someNegative = false;

    TRACE(if (verbosity > 2) std::cout << "c adding clause " << ps << std::endl);

    if (drup_file) {
        add_oc.clear();
        for (int i = 0; i < ps.size(); i++) add_oc.push(ps[i]);
    }

    for (i = j = 0, p = lit_Undef; i < ps.size(); i++)
        if (value(ps[i]) == l_True || ps[i] == ~p)
            return true;
        else if (value(ps[i]) != l_False && ps[i] != p) {
            ps[j++] = p = ps[i];
            somePositive = somePositive || !sign(p);
            someNegative = someNegative || sign(p);
        } else if (value(ps[i]) == l_False) {
            // for polarity analysis, we ignore unit propagation
            somePositive = somePositive || !sign(ps[i]);
            someNegative = someNegative || sign(ps[i]);
        }
    ps.shrink(i - j);

    /* if there are new clauses, we cannot claim that SLS solved the formula anymore */
    solved_by_ls = false;

    if (drup_file && i != j) {
#ifdef BIN_DRUP
        binDRUP('a', ps, drup_file);
        binDRUP('d', add_oc, drup_file);
#else
        for (int i = 0; i < ps.size(); i++) fprintf(drup_file, "%i ", (var(ps[i]) + 1) * (-2 * sign(ps[i]) + 1));
        fprintf(drup_file, "0\n");

        fprintf(drup_file, "d ");
        for (int i = 0; i < add_oc.size(); i++)
            fprintf(drup_file, "%i ", (var(add_oc[i]) + 1) * (-2 * sign(add_oc[i]) + 1));
        fprintf(drup_file, "0\n");
#endif
    }

    if (ps.size() == 0)
        return ok = false;
    else if (ps.size() == 1) {
        uncheckedEnqueue(ps[0], 0);
        return ok = (propagate() == CRef_Undef);
    } else {
        CRef cr = ca.alloc(ps, false);
        clauses.push(cr);
        attachClause(cr);
        // memorize for the whole formula to feed polarity heuristic
        if (systematic_branching_state == 0) {
            posMissingInSome = somePositive ? posMissingInSome : posMissingInSome + 1;
            negMissingInSome = someNegative ? negMissingInSome : negMissingInSome + 1;
        }
    }

    return true;
}